

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observers.h
# Opt level: O1

void __thiscall
obs::observers<Observer>::notify_observers<>
          (observers<Observer> *this,offset_in_observer_type_to_subr method)

{
  bool bVar1;
  code *pcVar2;
  long in_RDX;
  iterator __begin0;
  iterator __end0;
  iterator local_70;
  iterator local_48;
  
  safe_list<Observer>::begin(&local_70,&this->m_observers);
  safe_list<Observer>::end(&local_48,&this->m_observers);
  while( true ) {
    bVar1 = safe_list<Observer>::iterator::operator!=(&local_70,&local_48);
    if (!bVar1) {
      safe_list<Observer>::iterator::~iterator(&local_48);
      safe_list<Observer>::iterator::~iterator(&local_70);
      return;
    }
    if ((local_70.m_node == (node *)0x0) || (local_70.m_locked == false)) break;
    if (local_70.m_value != (Observer *)0x0) {
      pcVar2 = (code *)method;
      if ((method & 1) != 0) {
        pcVar2 = *(code **)(*(long *)((long)&(local_70.m_value)->_vptr_Observer + in_RDX) + -1 +
                           method);
      }
      (*pcVar2)();
    }
    safe_list<Observer>::iterator::operator++(&local_70);
  }
  __assert_fail("m_node && m_locked",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0xd8,"T *obs::safe_list<Observer>::iterator::operator*() const [T = Observer]");
}

Assistant:

void notify_observers(void (observer_type::*method)(Args...), Args ...args) {
    for (auto observer : m_observers) {
      if (observer)
        (observer->*method)(std::forward<Args>(args)...);
    }
  }